

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  _Setw _Var4;
  _Setprecision _Var5;
  unsigned_long uVar6;
  ostream *poVar7;
  ulong uVar8;
  sequence_gap_structure *psVar9;
  reference puVar10;
  ulong *puVar11;
  undefined8 *puVar12;
  size_type sVar13;
  long lVar14;
  undefined4 *puVar15;
  Vector *pVVar16;
  char *pcVar17;
  char *pcVar18;
  size_t sVar19;
  undefined4 uVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar34;
  long mapped_id;
  unsigned_long p_1;
  FILE *print_to_1;
  Vector *this_cluster_2;
  unsigned_long cid_1;
  unsigned_long pl;
  char *path_buffer;
  unsigned_long ci;
  unsigned_long my_non_gap;
  uchar *s;
  unsigned_long p;
  unsigned_long max_id;
  unsigned_long max_nongap;
  Vector *this_cluster_1;
  unsigned_long cid;
  FILE *print_to;
  double dt_2;
  unsigned_long first;
  iterator cluster_iterator;
  int e_1;
  double d_1;
  unsigned_long csi_1;
  unsigned_long seq;
  Vector *this_cluster;
  unsigned_long cc;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> join_to;
  char *base_sequence_1;
  unsigned_long seq1_1;
  unsigned_long mergers;
  iterator outer_iterator_1;
  double dt_1;
  unsigned_long e;
  double dt;
  double d;
  unsigned_long csi;
  unsigned_long current_cluster_seq;
  double distance;
  char *test_sequence;
  unsigned_long seq2;
  iterator inner_iterator;
  Vector *current_cluster;
  char *base_sequence;
  unsigned_long seq1;
  iterator outer_iterator;
  time_t after;
  time_t before;
  int resolutionOption;
  unsigned_long sid;
  double percentDone;
  sequence_gap_structure *sequence_descriptors;
  unsigned_long pairwise;
  unsigned_long sequenceCount;
  char automatonState;
  Clusters clusters;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> remaining;
  long firstSequenceLength;
  args_t args;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this;
  Clusters *in_stack_fffffffffffff770;
  uint uVar35;
  Clusters *this_00;
  long in_stack_fffffffffffff778;
  const_iterator __position;
  Vector *in_stack_fffffffffffff780;
  args_t *this_01;
  undefined8 in_stack_fffffffffffff788;
  uint argc_00;
  sequence_gap_structure *strings;
  args_t *in_stack_fffffffffffff790;
  FILE *in_stack_fffffffffffff798;
  char *in_stack_fffffffffffff7a0;
  unsigned_long in_stack_fffffffffffff7b0;
  unsigned_long in_stack_fffffffffffff7d8;
  Clusters *in_stack_fffffffffffff7e0;
  undefined8 in_stack_fffffffffffffa58;
  undefined1 progress;
  double in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa6c;
  undefined1 oneByOne;
  Vector *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  StringBuffer *in_stack_fffffffffffffa80;
  StringBuffer *in_stack_fffffffffffffa88;
  char *in_stack_fffffffffffffa90;
  FILE *in_stack_fffffffffffffa98;
  long *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  char in_stack_fffffffffffffac8;
  ulong uVar36;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  double in_stack_fffffffffffffae8;
  long *in_stack_fffffffffffffaf0;
  double in_stack_fffffffffffffaf8;
  ostream *in_stack_fffffffffffffb00;
  ostream *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  _Setprecision in_stack_fffffffffffffb14;
  ostream *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  _Setw in_stack_fffffffffffffb4c;
  ostream *in_stack_fffffffffffffb50;
  ostream *in_stack_fffffffffffffb58;
  sequence_gap_structure *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  _Setw in_stack_fffffffffffffb6c;
  sequence_gap_structure *local_3e8;
  ulong local_380;
  FILE *local_378;
  ulong local_368;
  size_t local_360;
  char *local_358;
  ulong local_350;
  ulong local_348;
  ulong local_338;
  ulong local_328;
  ulong local_318;
  FILE *local_310;
  _Self local_2d8;
  _Base_ptr local_2d0;
  unsigned_long local_2c8;
  _Self local_2c0 [4];
  double local_2a0;
  long local_298;
  ulong local_290;
  Vector *local_288;
  ulong local_280;
  _Base_ptr local_278;
  _Base_ptr local_270;
  char *local_238;
  unsigned_long local_230;
  _Self local_228;
  ulong local_220;
  _Self local_218;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  double local_200;
  _Base_ptr local_1f8;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  double local_1d0;
  _Base_ptr local_1c8;
  _Base_ptr local_1c0;
  double local_1b8;
  long local_1b0;
  ulong local_1a8;
  double local_1a0;
  char *local_198;
  unsigned_long local_190;
  _Self local_188;
  _Self local_180;
  _Base_ptr local_178;
  _Base_ptr local_170;
  Vector *local_168;
  char *local_160;
  unsigned_long local_158;
  _Self local_150;
  _Self local_148;
  time_t local_140;
  time_t local_138;
  undefined4 local_12c;
  _Base_ptr local_128;
  undefined1 local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  ulong local_f8;
  double local_f0;
  sequence_gap_structure *local_e8;
  ulong local_e0;
  ulong local_d8;
  undefined4 local_cc;
  undefined1 local_c5;
  Clusters local_b8 [2];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> local_68;
  byte local_38;
  char *local_28;
  double local_20;
  byte local_18;
  int local_4;
  undefined1 auVar25 [16];
  
  oneByOne = (undefined1)((uint)in_stack_fffffffffffffa6c >> 0x18);
  progress = (undefined1)((ulong)in_stack_fffffffffffffa58 >> 0x38);
  argc_00 = (uint)((ulong)in_stack_fffffffffffff788 >> 0x20);
  local_4 = 0;
  argparse::args_t::args_t(in_stack_fffffffffffff790,argc_00,(char **)in_stack_fffffffffffff780);
  local_68._M_t._M_impl._0_8_ = 0;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x106816);
  Clusters::Clusters(in_stack_fffffffffffff770);
  uVar35 = (uint)((ulong)in_stack_fffffffffffff770 >> 0x20);
  local_c5 = 0;
  Vector::appendValue(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  Vector::appendValue(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  uVar20 = (undefined4)((ulong)in_stack_fffffffffffff780 >> 0x20);
  initAlphabets(SUB81((ulong)in_stack_fffffffffffff7a0 >> 0x38,0),(char *)in_stack_fffffffffffff798,
                SUB81((ulong)in_stack_fffffffffffff790 >> 0x38,0));
  this = &local_68;
  strings = (sequence_gap_structure *)((ulong)argc_00 << 0x20);
  this_01 = (args_t *)CONCAT44(uVar20,0x3a);
  __position._M_node = (_Base_ptr)0x0;
  this_00 = (Clusters *)((ulong)uVar35 << 0x20);
  iVar3 = readFASTA(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                    in_stack_fffffffffffffa80,
                    (Vector *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                    in_stack_fffffffffffffa70,in_stack_fffffffffffffab0,(bool)oneByOne,
                    (Vector *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                    in_stack_fffffffffffffac8,in_stack_fffffffffffffa60,(bool)progress);
  if (iVar3 == 1) {
    local_4 = 1;
  }
  else {
    uVar6 = Vector::length(&seqLengths);
    local_d8 = uVar6 - 1;
    local_e0 = (uVar6 - 2) * local_d8 >> 1;
    if ((local_38 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Read ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_d8);
      poVar7 = std::operator<<(poVar7," sequences from input file ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"Will perform approximately ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_e0);
      std::operator<<(poVar7," pairwise distance calculations");
    }
    uVar36 = local_d8;
    local_e8 = (sequence_gap_structure *)0x0;
    resolve_fraction = local_20;
    local_f0 = 0.0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_d8;
    uVar8 = SUB168(auVar1 * ZEXT816(0x20),0);
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    psVar9 = (sequence_gap_structure *)operator_new__(uVar8);
    if (uVar36 != 0) {
      local_3e8 = psVar9;
      do {
        sequence_gap_structure::sequence_gap_structure(local_3e8);
        local_3e8 = local_3e8 + 1;
      } while (local_3e8 != psVar9 + uVar36);
    }
    local_e8 = psVar9;
    for (local_f8 = 0; local_f8 < local_d8; local_f8 = local_f8 + 1) {
      stringText((StringBuffer *)strings,(Vector *)this_01,(unsigned_long)__position._M_node);
      describe_sequence(in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798,
                        (unsigned_long)in_stack_fffffffffffff790);
      psVar9 = local_e8 + local_f8;
      psVar9->first_nongap = local_118;
      psVar9->last_nongap = local_110;
      psVar9->resolved_start = local_108;
      psVar9->resolved_end = local_100;
      if (((local_18 & 1) != 0) || (local_f8 != 0)) {
        pVar34 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_fffffffffffff790,(value_type_conflict *)strings);
        local_128 = (_Base_ptr)pVar34.first._M_node;
        local_120 = pVar34.second;
      }
    }
    if ((local_38 & 1) == 0) {
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar7,"Progress: ");
    }
    switch(local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_) {
    case 0:
      local_12c = 0;
      break;
    case 1:
      local_12c = 1;
      break;
    case 2:
      local_12c = 2;
      break;
    case 3:
      local_12c = 3;
      break;
    case 4:
      local_12c = 4;
    }
    time(&local_138);
    if (local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ == 0) {
      local_148._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     (this);
      while( true ) {
        local_150._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                       (this);
        bVar2 = std::operator!=(&local_148,&local_150);
        if (!bVar2) break;
        puVar10 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                            ((_Rb_tree_const_iterator<unsigned_long> *)0x106da8);
        local_158 = *puVar10;
        local_160 = stringText((StringBuffer *)strings,(Vector *)this_01,
                               (unsigned_long)__position._M_node);
        local_168 = Clusters::append_a_cluster(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
        local_178 = local_148._M_node;
        local_170 = (_Base_ptr)
                    std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
                    erase_abi_cxx11_((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                      *)this_00,__position);
        local_148._M_node = local_170;
        local_180._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin(this);
        while( true ) {
          local_188._M_node =
               (_Base_ptr)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               end(this);
          bVar2 = std::operator!=(&local_180,&local_188);
          if (!bVar2) break;
          puVar10 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                              ((_Rb_tree_const_iterator<unsigned_long> *)0x106ebb);
          local_190 = *puVar10;
          local_198 = stringText((StringBuffer *)strings,(Vector *)this_01,
                                 (unsigned_long)__position._M_node);
          strings = local_e8 + local_158;
          in_stack_fffffffffffff790 = (args_t *)(local_e8 + local_190);
          this_01 = (args_t *)0x1;
          __position._M_node = (_Base_ptr)0x1;
          this_00 = (Clusters *)0xc8;
          this = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)0x0
          ;
          local_1a0 = computeTN93((char *)CONCAT44(in_stack_fffffffffffffb14._M_n,
                                                   in_stack_fffffffffffffb10),
                                  (char *)in_stack_fffffffffffffb08,
                                  (unsigned_long)in_stack_fffffffffffffb00,
                                  (char)((ulong)in_stack_fffffffffffffaf8 >> 0x38),
                                  in_stack_fffffffffffffaf0,(long)in_stack_fffffffffffffae8,
                                  (unsigned_long *)in_stack_fffffffffffffb40,
                                  (double)CONCAT44(in_stack_fffffffffffffae4,
                                                   in_stack_fffffffffffffae0),
                                  CONCAT44(in_stack_fffffffffffffb4c._M_n,in_stack_fffffffffffffb48)
                                  ,(long)in_stack_fffffffffffffb50,(long)in_stack_fffffffffffffb58,
                                  in_stack_fffffffffffffb60,
                                  (sequence_gap_structure *)
                                  CONCAT44(in_stack_fffffffffffffb6c._M_n,in_stack_fffffffffffffb68)
                                 );
          if ((double)local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent < local_1a0) {
            puVar12 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar12 = 0;
            __cxa_throw(puVar12,&unsigned_long::typeinfo,0);
          }
          for (local_1a8 = 1; uVar36 = local_1a8, uVar6 = Vector::length(local_168), uVar36 < uVar6;
              local_1a8 = local_1a8 + 1) {
            local_1b0 = Vector::value(local_168,local_1a8);
            stringText((StringBuffer *)strings,(Vector *)this_01,(unsigned_long)__position._M_node);
            strings = local_e8 + local_190;
            in_stack_fffffffffffff790 = (args_t *)(local_e8 + local_1b0);
            this_01 = (args_t *)0x1;
            __position._M_node = (_Base_ptr)0x1;
            this_00 = (Clusters *)0xc8;
            this = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x0;
            local_1b8 = computeTN93((char *)CONCAT44(in_stack_fffffffffffffb14._M_n,
                                                     in_stack_fffffffffffffb10),
                                    (char *)in_stack_fffffffffffffb08,
                                    (unsigned_long)in_stack_fffffffffffffb00,
                                    (char)((ulong)in_stack_fffffffffffffaf8 >> 0x38),
                                    in_stack_fffffffffffffaf0,(long)in_stack_fffffffffffffae8,
                                    (unsigned_long *)in_stack_fffffffffffffb40,
                                    (double)CONCAT44(in_stack_fffffffffffffae4,
                                                     in_stack_fffffffffffffae0),
                                    CONCAT44(in_stack_fffffffffffffb4c._M_n,
                                             in_stack_fffffffffffffb48),
                                    (long)in_stack_fffffffffffffb50,(long)in_stack_fffffffffffffb58,
                                    in_stack_fffffffffffffb60,
                                    (sequence_gap_structure *)
                                    CONCAT44(in_stack_fffffffffffffb6c._M_n,
                                             in_stack_fffffffffffffb68));
            if (((double)local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent < local_1b8
                ) || (local_1b8 < 0.0)) {
              puVar11 = (ulong *)__cxa_allocate_exception(8);
              *puVar11 = local_1a8;
              __cxa_throw(puVar11,&unsigned_long::typeinfo,0);
            }
          }
          Vector::appendValue((Vector *)this_01,(long)__position._M_node);
          local_1c8 = local_180._M_node;
          local_1c0 = (_Base_ptr)
                      std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      ::erase_abi_cxx11_((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                          *)this_00,__position);
          local_180._M_node = local_1c0;
          if ((local_38 & 1) == 0) {
            time(&local_140);
            local_1d0 = difftime(local_140,local_138);
            uVar36 = local_d8;
            if (0.0 < local_1d0) {
              sVar13 = std::
                       set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)0x1072e7);
              lVar14 = uVar36 - sVar13;
              auVar22._8_4_ = (int)((ulong)lVar14 >> 0x20);
              auVar22._0_8_ = lVar14;
              auVar22._12_4_ = 0x45300000;
              auVar28._8_4_ = (int)(local_d8 >> 0x20);
              auVar28._0_8_ = local_d8;
              auVar28._12_4_ = 0x45300000;
              local_f0 = (((auVar22._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) * 100.0)
                         / ((auVar28._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_d8) - 4503599627370496.0));
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                      );
              in_stack_fffffffffffffb6c = std::setw(8);
              local_1d4 = in_stack_fffffffffffffb6c._M_n;
              in_stack_fffffffffffffb60 =
                   (sequence_gap_structure *)std::operator<<(poVar7,in_stack_fffffffffffffb6c);
              in_stack_fffffffffffffb58 =
                   (ostream *)
                   std::ostream::operator<<((ostream *)in_stack_fffffffffffffb60,local_f0);
              in_stack_fffffffffffffb50 = std::operator<<(in_stack_fffffffffffffb58,"% (");
              in_stack_fffffffffffffb4c = std::setw(8);
              local_1d8 = in_stack_fffffffffffffb4c._M_n;
              in_stack_fffffffffffffb40 =
                   std::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
              uVar6 = Clusters::size(local_b8);
              poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffb40,uVar6);
              poVar7 = std::operator<<(poVar7," clusters created, ");
              local_1dc = (int)std::setw(0xc);
              poVar7 = std::operator<<(poVar7,(_Setw)local_1dc);
              in_stack_fffffffffffffb14 = std::setprecision(3);
              local_1e0 = in_stack_fffffffffffffb14._M_n;
              in_stack_fffffffffffffb08 = std::operator<<(poVar7,in_stack_fffffffffffffb14);
              in_stack_fffffffffffffae0 = 0;
              in_stack_fffffffffffffae4 = 0;
              auVar23._8_4_ = (int)(local_d8 >> 0x20);
              auVar23._0_8_ = local_d8;
              auVar23._12_4_ = 0x45300000;
              in_stack_fffffffffffffae8 = 4503599627370496.0;
              in_stack_fffffffffffffaf0 = (long *)0x4530000000000000;
              in_stack_fffffffffffffaf8 =
                   (auVar23._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_d8) - 4503599627370496.0);
              sVar13 = std::
                       set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)0x10754d);
              auVar29._8_4_ = (int)(sVar13 >> 0x20);
              auVar29._0_8_ = sVar13;
              auVar29._12_4_ = 0x45300000;
              in_stack_fffffffffffffb00 =
                   (ostream *)
                   std::ostream::operator<<
                             (in_stack_fffffffffffffb08,
                              (in_stack_fffffffffffffaf8 -
                              ((auVar29._8_8_ - (double)in_stack_fffffffffffffaf0) +
                              ((double)CONCAT44(0x43300000,(int)sVar13) - in_stack_fffffffffffffae8)
                              )) / local_1d0);
              std::operator<<(in_stack_fffffffffffffb00," sequences clustered/sec)");
              local_140 = local_138;
            }
          }
        }
        local_1f8 = (_Base_ptr)
                    std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    begin(this);
        local_148._M_node = local_1f8;
        if ((local_38 & 1) == 0) {
          time(&local_140);
          local_200 = difftime(local_140,local_138);
          if (0.0 < local_200) {
            uVar36 = local_d8;
            sVar13 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)0x107664);
            lVar14 = uVar36 - sVar13;
            auVar24._8_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar24._0_8_ = lVar14;
            auVar24._12_4_ = 0x45300000;
            auVar30._8_4_ = (int)(local_d8 >> 0x20);
            auVar30._0_8_ = local_d8;
            auVar30._12_4_ = 0x45300000;
            local_f0 = (((auVar24._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) * 100.0) /
                       ((auVar30._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_d8) - 4503599627370496.0));
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                    );
            local_204 = (int)std::setw(8);
            poVar7 = std::operator<<(poVar7,(_Setw)local_204);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_f0);
            poVar7 = std::operator<<(poVar7,"% (");
            local_208 = (int)std::setw(8);
            poVar7 = std::operator<<(poVar7,(_Setw)local_208);
            uVar6 = Clusters::size(local_b8);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
            poVar7 = std::operator<<(poVar7," clusters created, ");
            local_20c = (int)std::setw(0xc);
            poVar7 = std::operator<<(poVar7,(_Setw)local_20c);
            local_210 = (int)std::setprecision(3);
            poVar7 = std::operator<<(poVar7,(_Setprecision)local_210);
            auVar25._8_4_ = (int)(local_d8 >> 0x20);
            auVar25._0_8_ = local_d8;
            auVar25._12_4_ = 0x45300000;
            uVar20 = (undefined4)local_d8;
            sVar13 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)0x1078ca);
            auVar31._8_4_ = (int)(sVar13 >> 0x20);
            auVar31._0_8_ = sVar13;
            auVar31._12_4_ = 0x45300000;
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               (poVar7,(((auVar25._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,uVar20) - 4503599627370496.0))
                                       - ((auVar31._8_8_ - 1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)sVar13) -
                                         4503599627370496.0))) / local_200);
            std::operator<<(poVar7," sequences clustered/sec)");
            local_140 = local_138;
          }
        }
      }
    }
    else {
      local_218._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     (this);
      local_220 = 0;
      while( true ) {
        local_228._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                       (this);
        bVar2 = std::operator!=(&local_218,&local_228);
        if (!bVar2) break;
        puVar10 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                            ((_Rb_tree_const_iterator<unsigned_long> *)0x1079b6);
        local_230 = *puVar10;
        local_238 = stringText((StringBuffer *)strings,(Vector *)this_01,
                               (unsigned_long)__position._M_node);
        Clusters::remove_blanks((Clusters *)this_01);
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x107a12);
        local_278 = local_218._M_node;
        local_270 = (_Base_ptr)
                    std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
                    erase_abi_cxx11_((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                      *)this_00,__position);
        local_218._M_node = local_270;
        for (local_280 = 0; uVar36 = local_280, uVar6 = Clusters::size(local_b8), uVar36 < uVar6;
            local_280 = local_280 + 1) {
          local_288 = Clusters::operator[](this_00,(unsigned_long)this);
          for (local_290 = 0; uVar36 = local_290, uVar6 = Vector::length(local_288), uVar36 < uVar6;
              local_290 = local_290 + 1) {
            local_298 = Vector::value(local_288,local_290);
            stringText((StringBuffer *)strings,(Vector *)this_01,(unsigned_long)__position._M_node);
            strings = local_e8 + local_230;
            in_stack_fffffffffffff790 = (args_t *)(local_e8 + local_298);
            this_01 = (args_t *)0x1;
            __position._M_node = (_Base_ptr)0x1;
            this_00 = (Clusters *)0xc8;
            this = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x0;
            local_2a0 = computeTN93((char *)CONCAT44(in_stack_fffffffffffffb14._M_n,
                                                     in_stack_fffffffffffffb10),
                                    (char *)in_stack_fffffffffffffb08,
                                    (unsigned_long)in_stack_fffffffffffffb00,
                                    (char)((ulong)in_stack_fffffffffffffaf8 >> 0x38),
                                    in_stack_fffffffffffffaf0,(long)in_stack_fffffffffffffae8,
                                    (unsigned_long *)in_stack_fffffffffffffb40,
                                    (double)CONCAT44(in_stack_fffffffffffffae4,
                                                     in_stack_fffffffffffffae0),
                                    CONCAT44(in_stack_fffffffffffffb4c._M_n,
                                             in_stack_fffffffffffffb48),
                                    (long)in_stack_fffffffffffffb50,(long)in_stack_fffffffffffffb58,
                                    in_stack_fffffffffffffb60,
                                    (sequence_gap_structure *)
                                    CONCAT44(in_stack_fffffffffffffb6c._M_n,
                                             in_stack_fffffffffffffb68));
            if ((0.0 <= local_2a0) &&
               (local_2a0 <= (double)local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
               )) {
              puVar15 = (undefined4 *)__cxa_allocate_exception(4);
              *puVar15 = 0;
              __cxa_throw(puVar15,&int::typeinfo,0);
            }
          }
        }
        bVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                empty((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x107d93);
        if (bVar2) {
          Clusters::append_a_cluster(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
        }
        else {
          local_2c0[0]._M_node =
               (_Base_ptr)
               std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               begin(this);
          puVar10 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                              ((_Rb_tree_const_iterator<unsigned_long> *)0x107dd7);
          local_2c8 = *puVar10;
          Clusters::operator[](this_00,(unsigned_long)this);
          Vector::appendValue((Vector *)this_01,(long)__position._M_node);
          local_2d0 = (_Base_ptr)
                      std::_Rb_tree_const_iterator<unsigned_long>::operator++
                                (__position._M_node,(int)((ulong)this_00 >> 0x20));
          while( true ) {
            local_2d8._M_node =
                 (_Base_ptr)
                 std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 end(this);
            bVar2 = std::operator!=(local_2c0,&local_2d8);
            if (!bVar2) break;
            std::_Rb_tree_const_iterator<unsigned_long>::operator*
                      ((_Rb_tree_const_iterator<unsigned_long> *)0x107e7c);
            Clusters::merge_clusters
                      ((Clusters *)this_01,(unsigned_long)__position._M_node,(unsigned_long)this_00)
            ;
            local_220 = local_220 + 1;
            std::_Rb_tree_const_iterator<unsigned_long>::operator++
                      ((_Rb_tree_const_iterator<unsigned_long> *)__position._M_node,
                       (int)((ulong)this_00 >> 0x20));
          }
        }
        local_218._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin(this);
        if ((local_38 & 1) == 0) {
          time(&local_140);
          dVar21 = difftime(local_140,local_138);
          uVar36 = local_d8;
          if (0.0 < dVar21) {
            sVar13 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)0x107f59);
            lVar14 = uVar36 - sVar13;
            auVar26._8_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar26._0_8_ = lVar14;
            auVar26._12_4_ = 0x45300000;
            auVar32._8_4_ = (int)(local_d8 >> 0x20);
            auVar32._0_8_ = local_d8;
            auVar32._12_4_ = 0x45300000;
            local_f0 = (((auVar26._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) * 100.0) /
                       ((auVar32._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_d8) - 4503599627370496.0));
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                    );
            _Var4 = std::setw(8);
            poVar7 = std::operator<<(poVar7,_Var4);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_f0);
            poVar7 = std::operator<<(poVar7,"% (");
            _Var4 = std::setw(8);
            poVar7 = std::operator<<(poVar7,_Var4);
            uVar6 = Clusters::size(local_b8);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
            poVar7 = std::operator<<(poVar7,"[");
            _Var4 = std::setw(8);
            poVar7 = std::operator<<(poVar7,_Var4);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_220);
            poVar7 = std::operator<<(poVar7,"] clusters created [merged], ");
            _Var4 = std::setw(0xc);
            poVar7 = std::operator<<(poVar7,_Var4);
            _Var5 = std::setprecision(3);
            poVar7 = std::operator<<(poVar7,_Var5);
            auVar27._8_4_ = (int)(local_d8 >> 0x20);
            auVar27._0_8_ = local_d8;
            auVar27._12_4_ = 0x45300000;
            uVar20 = (undefined4)local_d8;
            sVar13 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)0x10823b);
            auVar33._8_4_ = (int)(sVar13 >> 0x20);
            auVar33._0_8_ = sVar13;
            auVar33._12_4_ = 0x45300000;
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               (poVar7,(((auVar27._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,uVar20) - 4503599627370496.0))
                                       - ((auVar33._8_8_ - 1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)sVar13) -
                                         4503599627370496.0))) / dVar21);
            std::operator<<(poVar7," sequences clustered/sec)");
            local_140 = local_138;
          }
        }
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x1082c9);
      }
    }
    if ((local_38 & 1) == 0) {
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"Created ");
      uVar6 = Clusters::size(local_b8);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
      poVar7 = std::operator<<(poVar7," clusters");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    Clusters::remove_blanks((Clusters *)this_01);
    if ((int)local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_right == 0) {
      if (local_28 == (char *)0x0) {
        local_310 = _stdout;
      }
      else {
        local_310 = fopen(local_28,"w");
        if (local_310 == (FILE *)0x0) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to open \'");
          poVar7 = std::operator<<(poVar7,local_28);
          poVar7 = std::operator<<(poVar7,"\' for writing");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          exit(0);
        }
      }
      fprintf(local_310,"[");
      for (local_318 = 0; uVar6 = Clusters::size(local_b8), local_318 < uVar6;
          local_318 = local_318 + 1) {
        pVVar16 = Clusters::operator[](this_00,(unsigned_long)this);
        if (local_318 != 0) {
          fprintf(local_310,",");
        }
        local_328 = 0;
        uVar6 = Vector::length(pVVar16);
        fprintf(local_310,"\n\t{\n\t\t\"size\" : %ld, \n\t\t\"members\" : [",uVar6);
        for (local_338 = 0; uVar6 = Vector::length(pVVar16), local_338 < uVar6;
            local_338 = local_338 + 1) {
          pcVar17 = "\"%s\"";
          if (local_338 != 0) {
            pcVar17 = ",\"%s\"";
          }
          Vector::value(pVVar16,local_338);
          pcVar18 = stringText((StringBuffer *)strings,(Vector *)this_01,
                               (unsigned_long)__position._M_node);
          fprintf(local_310,pcVar17,pcVar18);
          Vector::value(pVVar16,local_338);
          pcVar17 = stringText((StringBuffer *)strings,(Vector *)this_01,
                               (unsigned_long)__position._M_node);
          local_348 = 0;
          for (local_350 = 0; local_350 < (ulong)local_68._M_t._M_impl._0_8_;
              local_350 = local_350 + 1) {
            if ((resolutionsCount[(byte)pcVar17[local_350]] == 1.0) &&
               (!NAN(resolutionsCount[(byte)pcVar17[local_350]]))) {
              local_348 = local_348 + 1;
            }
          }
          if (local_328 < local_348) {
            local_328 = local_348;
            Vector::value(pVVar16,local_338);
          }
        }
        pcVar17 = stringText((StringBuffer *)strings,(Vector *)this_01,
                             (unsigned_long)__position._M_node);
        fprintf(local_310,"],\n\t\t\"centroid\" : \">%s\\n",pcVar17);
        stringText((StringBuffer *)strings,(Vector *)this_01,(unsigned_long)__position._M_node);
        this = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)0x0;
        dump_fasta(in_stack_fffffffffffff7a0,(long)in_stack_fffffffffffff798,
                   (FILE *)in_stack_fffffffffffff790,SUB81((ulong)strings >> 0x38,0),
                   SUB81((ulong)strings >> 0x30,0),(unsigned_long)this_01,in_stack_fffffffffffff7b0)
        ;
        fprintf(local_310,"\\n\"\n\t}");
      }
      fprintf(local_310,"\n]\n");
      if (local_28 != (char *)0x0) {
        fclose(local_310);
      }
    }
    else {
      local_358 = (char *)0x0;
      local_360 = 0;
      if (local_28 != (char *)0x0) {
        sVar19 = strlen(local_28);
        local_360 = sVar19 + 0x80;
        local_358 = (char *)operator_new__(local_360);
      }
      for (local_368 = 0; uVar6 = Clusters::size(local_b8), local_368 < uVar6;
          local_368 = local_368 + 1) {
        pVVar16 = Clusters::operator[](this_00,(unsigned_long)this);
        if (local_28 == (char *)0x0) {
          local_378 = _stdout;
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"============================");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          snprintf(local_358,local_360,"%s.%lu",local_28,local_368);
          local_378 = fopen(local_358,"w");
          if (local_378 == (FILE *)0x0) {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to open \'");
            poVar7 = std::operator<<(poVar7,local_358);
            poVar7 = std::operator<<(poVar7,"\' for writing");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            exit(0);
          }
        }
        for (local_380 = 0; uVar6 = Vector::length(pVVar16), local_380 < uVar6;
            local_380 = local_380 + 1) {
          uVar6 = Vector::value(pVVar16,local_380);
          this = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)0x0
          ;
          dump_sequence_fasta((unsigned_long)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
                              (long)in_stack_fffffffffffff790,(double *)strings,
                              SUB81((ulong)this_01 >> 0x38,0),(unsigned_long)__position._M_node,
                              uVar6);
        }
        if (local_28 != (char *)0x0) {
          fclose(local_378);
        }
      }
      if ((local_28 != (char *)0x0) && (local_358 != (char *)0x0)) {
        operator_delete__(local_358);
      }
    }
    if (local_e8 != (sequence_gap_structure *)0x0) {
      operator_delete__(local_e8);
    }
    local_4 = 0;
  }
  local_cc = 1;
  Clusters::~Clusters((Clusters *)this_01);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x108c46);
  argparse::args_t::~args_t(this_01);
  return local_4;
}

Assistant:

int main(int argc, const char *argv[]) {
  args_t args = args_t(argc, argv);

  long firstSequenceLength = 0;

  set<unsigned long> remaining; // sequence ids not yet clustered

  Clusters clusters;

  char automatonState = 0;
  // 0 - between sequences
  // 1 - reading sequence name
  // 2 - reading sequence

  nameLengths.appendValue(0);
  seqLengths.appendValue(0);

  initAlphabets(false, args.ambigs_to_resolve);
  if (readFASTA(args.input, automatonState, names, sequences, nameLengths,
                seqLengths, firstSequenceLength) == 1)
    return 1;

  unsigned long sequenceCount = seqLengths.length() - 1,
                pairwise = (sequenceCount - 1L) * (sequenceCount) / 2;

  if (!args.quiet) {
    cerr << "Read " << sequenceCount << " sequences from input file " << endl
         << "Will perform approximately " << pairwise
         << " pairwise distance calculations";
  }

  sequence_gap_structure *sequence_descriptors = NULL;

  resolve_fraction = args.resolve_fraction;

  double percentDone = 0.;

  sequence_descriptors = new sequence_gap_structure[sequenceCount];
  for (unsigned long sid = 0UL; sid < sequenceCount; sid++) {
    sequence_descriptors[sid] = describe_sequence(
        stringText(sequences, seqLengths, sid), firstSequenceLength);
    if (args.first_regular || sid > 0UL) {
      remaining.insert(sid);
    }
  }

  if (!args.quiet)
    cerr << endl << "Progress: ";

  int resolutionOption;
  switch (args.ambig) {
  case resolve:
    resolutionOption = RESOLVE;
    break;
  case average:
    resolutionOption = AVERAGE;
    break;
  case skip:
    resolutionOption = SKIP;
    break;
  case gapmm:
    resolutionOption = GAPMM;
    break;
  case subset:
    resolutionOption = SUBSET;
    break;
  }

  time_t before, after;
  time(&before);

  if (args.cluster_type == all) {

    auto outer_iterator = remaining.begin();

    while (outer_iterator != remaining.end()) {

      unsigned long seq1 = *outer_iterator;

      char *base_sequence = stringText(sequences, seqLengths, seq1);

      Vector *current_cluster = clusters.append_a_cluster(seq1);

      outer_iterator = remaining.erase(outer_iterator);

      auto inner_iterator = remaining.begin();

      while (inner_iterator != remaining.end()) {

        unsigned long seq2 = *inner_iterator;
        char *test_sequence = stringText(sequences, seqLengths, seq2);

        try {
          double distance = computeTN93(
              base_sequence, test_sequence, firstSequenceLength,
              resolutionOption, NULL, args.overlap, NULL, HISTOGRAM_SLICE,
              HISTOGRAM_BINS, 1L, 1L, &sequence_descriptors[seq1],
              &sequence_descriptors[seq2]);

          if (distance <= args.distance) {
            // check if this can be merged into the current cluster
            for (unsigned long current_cluster_seq = 1UL;
                 current_cluster_seq < current_cluster->length();
                 current_cluster_seq++) {
              unsigned long csi = current_cluster->value(current_cluster_seq);
              double d = computeTN93(
                  test_sequence, stringText(sequences, seqLengths, csi),
                  firstSequenceLength, resolutionOption, NULL, args.overlap,
                  NULL, HISTOGRAM_SLICE, HISTOGRAM_BINS, 1L, 1L,
                  &sequence_descriptors[seq2], &sequence_descriptors[csi]);
                if (d > args.distance || d < 0.) {
                    throw(current_cluster_seq);
                }
            }
          } else {
            throw(0UL);
          }
          current_cluster->appendValue(seq2);
          //cerr << "removing " << seq2 << " : " << remaining.size() << " / " << current_cluster->length() << endl;
          inner_iterator = remaining.erase(inner_iterator);
            if (!args.quiet) {
              time(&after);
              double dt = difftime(after, before);
              if (dt > 0.) {
                percentDone =
                    (sequenceCount - remaining.size()) * 100. / sequenceCount;
                cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                        "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                        "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                        ":"
                     << setw(8) << percentDone << "% (" << setw(8) << clusters.size()
                     << " clusters created, " << setw(12) << std::setprecision(3)
                     << ((double)sequenceCount - remaining.size()) / dt
                     << " sequences clustered/sec)";

                after = before;
              }
            }
        } catch (unsigned long e) {
          //cerr << "mismatch at " << e << endl;
          inner_iterator++;
        }
      }

      outer_iterator = remaining.begin();
      if (!args.quiet) {
        time(&after);
        double dt = difftime(after, before);
        if (dt > 0.) {
          percentDone =
              (sequenceCount - remaining.size()) * 100. / sequenceCount;
          cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                  ":"
               << setw(8) << percentDone << "% (" << setw(8) << clusters.size()
               << " clusters created, " << setw(12) << std::setprecision(3)
               << ((double)sequenceCount - remaining.size()) / dt
               << " sequences clustered/sec)";

          after = before;
        }
      }
    }
  } else {
    auto outer_iterator = remaining.begin();

    // the idea here is to first iterate over all existing clusters
    // if the remaining sequence can be joined to some of the clusters,
    // then these clusters will be joined together and augmented with the new
    // sequence

    // failing that, the new sequence gets its own cluster

    unsigned long mergers = 0UL;

    while (outer_iterator != remaining.end()) {

      unsigned long seq1 = *outer_iterator;
      char *base_sequence = stringText(sequences, seqLengths, seq1);

      clusters.remove_blanks();

      set<unsigned long> join_to;

      outer_iterator = remaining.erase(outer_iterator);

#pragma omp parallel shared(clusters, sequence_descriptors, resolutionOption,  \
                            sequences, seqLengths, sequenceCount,              \
                            firstSequenceLength, args, nameLengths, names,     \
                            percentDone, cerr)
      for (unsigned long cc = 0UL; cc < clusters.size(); cc++) {
        Vector const *this_cluster = clusters[cc];

        try {
          for (unsigned long seq = 0UL; seq < this_cluster->length(); seq++) {
            unsigned long csi = this_cluster->value(seq);
            double d = computeTN93(
                base_sequence, stringText(sequences, seqLengths, csi),
                firstSequenceLength, resolutionOption, NULL, args.overlap, NULL,
                HISTOGRAM_SLICE, HISTOGRAM_BINS, 1L, 1L,
                &sequence_descriptors[seq1], &sequence_descriptors[csi]);
            if (d >= 0. && d <= args.distance) {
              throw(0);
            }
          }
        } catch (int e) {
#pragma omp critical
          join_to.insert(cc);
        }
      }

      if (join_to.empty()) {
        // create new cluster
        clusters.append_a_cluster(seq1);

      } else {
        auto cluster_iterator = join_to.begin();
        unsigned long first = *cluster_iterator;
        clusters[first]->appendValue(seq1);
        cluster_iterator++;
        while (cluster_iterator != join_to.end()) {
          // cout << "Merging " << first << " and " << *cluster_iterator << " on
          // " << seq1 << endl;
          clusters.merge_clusters(first, *cluster_iterator);
          mergers++;
          cluster_iterator++;
        }
      }

      outer_iterator = remaining.begin();
      if (!args.quiet) {
        time(&after);
        double dt = difftime(after, before);
        if (dt > 0.) {
          percentDone =
              (sequenceCount - remaining.size()) * 100. / sequenceCount;
          cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
               << setw(8) << percentDone << "% (" << setw(8) << clusters.size()
               << "[" << setw(8) << mergers << "] clusters created [merged], "
               << setw(12) << std::setprecision(3)
               << ((double)sequenceCount - remaining.size()) / dt
               << " sequences clustered/sec)";

          after = before;
        }
      }
    }
  }

  if (!args.quiet) {
    cerr << endl << "Created " << clusters.size() << " clusters" << endl;
  }
  clusters.remove_blanks();

  if (args.output_mode == json) {
    FILE *print_to;

    if (args.trunk_path) {
      print_to = fopen(args.trunk_path, "w");
      if (!print_to) {
        cerr << "Failed to open '" << args.trunk_path << "' for writing"
             << endl;
        exit(0);
      }
    } else {
      print_to = stdout;
    }

    fprintf(print_to, "[");
    for (unsigned long cid = 0; cid < clusters.size(); cid++) {
      Vector *this_cluster = clusters[cid];
      if (cid) {
        fprintf(print_to, ",");
      }

      unsigned long max_nongap = 0UL, max_id = 0UL;

      fprintf(print_to, "\n\t{\n\t\t\"size\" : %ld, \n\t\t\"members\" : [",
              this_cluster->length());
      for (unsigned long p = 0; p < this_cluster->length(); p++) {
        fprintf(print_to, p ? ",\"%s\"" : "\"%s\"",
                stringText(names, nameLengths, this_cluster->value(p)));
        unsigned char *s = (unsigned char *)stringText(sequences, seqLengths,
                                                       this_cluster->value(p));
        unsigned long my_non_gap = 0UL;
        for (unsigned long ci = 0; ci < firstSequenceLength; ci++) {
          if (resolutionsCount[s[ci]] == 1.f) {
            my_non_gap++;
          }
        }
        if (my_non_gap > max_nongap) {
          max_nongap = my_non_gap;
          max_id = this_cluster->value(p);
        }
      }
      fprintf(print_to, "],\n\t\t\"centroid\" : \">%s\\n",
              stringText(names, nameLengths, max_id));
      dump_fasta(stringText(sequences, seqLengths, max_id), firstSequenceLength,
                 print_to, false);
      // dump_sequence_fasta (max_id, print_to, firstSequenceLength);
      fprintf(print_to, "\\n\"\n\t}");
    }
    fprintf(print_to, "\n]\n");

    if (args.trunk_path) {
      fclose(print_to);
    }

  } else {
    char *path_buffer = NULL;
    unsigned long pl = 0UL;
    if (args.trunk_path) {
      pl = strlen(args.trunk_path) + 128;
      path_buffer = new char[pl];
    }
    for (unsigned long cid = 0; cid < clusters.size(); cid++) {
      Vector *this_cluster = clusters[cid];

      FILE *print_to;

      if (args.trunk_path) {
        snprintf(path_buffer, pl, "%s.%lu", args.trunk_path, cid);
        // cout << path_buffer << endl;
        print_to = fopen(path_buffer, "w");
        if (!print_to) {
          cerr << "Failed to open '" << path_buffer << "' for writing" << endl;
          exit(0);
        }
      } else {
        print_to = stdout;
        cout << endl << "============================" << endl;
      }
      for (unsigned long p = 0; p < this_cluster->length(); p++) {
        long mapped_id = this_cluster->value(p);
        // cout << mapped_id << endl;
        dump_sequence_fasta(mapped_id, print_to, firstSequenceLength);
      }

      if (args.trunk_path) {
        fclose(print_to);
      }
    }
    if (args.trunk_path) {
      delete[] path_buffer;
    }
  }

  delete[] sequence_descriptors;
  return 0;
}